

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hh
# Opt level: O0

void __thiscall Matrix<double>::Matrix(Matrix<double> *this,int rr,int cc,double init)

{
  int iVar1;
  int iVar2;
  allocator<std::vector<double,_std::allocator<double>_>_> local_4d [20];
  allocator<double> local_39;
  vector<double,_std::allocator<double>_> local_38;
  double local_20;
  double init_local;
  int cc_local;
  int rr_local;
  Matrix<double> *this_local;
  
  this->r = rr;
  this->c = cc;
  iVar1 = this->r;
  iVar2 = this->c;
  local_20 = init;
  init_local._0_4_ = cc;
  init_local._4_4_ = rr;
  _cc_local = this;
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector(&local_38,(long)iVar2,&local_20,&local_39);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(local_4d);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->t,(long)iVar1,&local_38,local_4d);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(local_4d);
  std::vector<double,_std::allocator<double>_>::~vector(&local_38);
  std::allocator<double>::~allocator(&local_39);
  return;
}

Assistant:

Matrix(int rr, int cc, T init=T()) :
		r(rr), c(cc), t(vector<vector<T> >(r, vector<T>(c, init))) {}